

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_variable_temporary_copies(CompilerGLSL *this,SPIRVariable *var)

{
  Bitset *pBVar1;
  uint32_t id;
  size_type sVar2;
  bool bVar3;
  uint32_t local_a8 [4];
  spirv_cross local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  undefined1 local_58 [48];
  Bitset *flags;
  SPIRType *type;
  SPIRVariable *local_18;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  bVar3 = false;
  local_18 = var;
  var_local = (SPIRVariable *)this;
  if ((var->allocate_temporary_copy & 1U) != 0) {
    type._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
    sVar2 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->flushed_phi_variables,(key_type *)((long)&type + 4));
    bVar3 = sVar2 == 0;
  }
  if (bVar3) {
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_18->super_IVariant).field_0xc);
    flags = (Bitset *)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
    local_58._36_4_ = (local_18->super_IVariant).self.id;
    local_58._40_8_ = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)local_58._36_4_);
    flags_to_qualifiers_glsl_abi_cxx11_((CompilerGLSL *)local_58,(SPIRType *)this,flags);
    pBVar1 = flags;
    join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
              (local_98,(char (*) [2])0x40fecd,&(local_18->super_IVariant).self,
               (char (*) [6])0x40bc1d);
    (*(this->super_Compiler)._vptr_Compiler[0x1b])(local_78,this,pBVar1,local_98,0);
    statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               local_78,(char (*) [2])0x42463b);
    ::std::__cxx11::string::~string((string *)local_78);
    ::std::__cxx11::string::~string((string *)local_98);
    ::std::__cxx11::string::~string((string *)local_58);
    local_a8[0] = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_18->super_IVariant).self);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->flushed_phi_variables,local_a8);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_variable_temporary_copies(const SPIRVariable &var)
{
	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	if (var.allocate_temporary_copy && !flushed_phi_variables.count(var.self))
	{
		auto &type = get<SPIRType>(var.basetype);
		auto &flags = get_decoration_bitset(var.self);
		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, join("_", var.self, "_copy")), ";");
		flushed_phi_variables.insert(var.self);
	}
}